

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_checkExpectationsClearsTheExpectations_TestShell::
~TEST_MockCallTest_checkExpectationsClearsTheExpectations_TestShell
          (TEST_MockCallTest_checkExpectationsClearsTheExpectations_TestShell *this)

{
  TEST_MockCallTest_checkExpectationsClearsTheExpectations_TestShell *this_local;
  
  ~TEST_MockCallTest_checkExpectationsClearsTheExpectations_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCallTest, checkExpectationsClearsTheExpectations)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("foobar");
    mock().checkExpectations();

    CHECK(! mock().expectedCallsLeft());
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}